

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O1

void C_NameKeys(char *str,int first,int second)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  
  *str = '\0';
  if (first == 0) {
    bVar1 = false;
  }
  else {
    pcVar3 = KeyNames[first];
    if (pcVar3 == (char *)0x0) {
      pcVar3 = &KeyName(int)::name;
      mysnprintf(&KeyName(int)::name,5,"Key_%d",first);
    }
    strcpy(str,pcVar3);
    bVar1 = true;
    if (second != 0) {
      sVar2 = strlen(str);
      builtin_strncpy(str + sVar2," or ",5);
    }
  }
  if (second != 0) {
    pcVar3 = KeyNames[second];
    if (pcVar3 == (char *)0x0) {
      pcVar3 = &KeyName(int)::name;
      mysnprintf(&KeyName(int)::name,5,"Key_%d",(ulong)(uint)second);
    }
    strcat(str,pcVar3);
    bVar1 = true;
  }
  if (!bVar1) {
    *str = '\0';
  }
  return;
}

Assistant:

void C_NameKeys (char *str, int first, int second)
{
	int c = 0;

	*str = 0;
	if (first)
	{
		c++;
		strcpy (str, KeyName (first));
		if (second)
			strcat (str, " or ");
	}

	if (second)
	{
		c++;
		strcat (str, KeyName (second));
	}

	if (!c)
		*str = '\0';
}